

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

bool __thiscall FMapInfoParser::ParseCloseBrace(FMapInfoParser *this)

{
  bool bVar1;
  
  if (this->format_type == 2) {
    bVar1 = FScanner::Compare(&this->sc,"}");
    return bVar1;
  }
  FScanner::UnGet(&this->sc);
  return true;
}

Assistant:

bool FMapInfoParser::ParseCloseBrace()
{
	if (format_type == FMT_New)
	{
		return sc.Compare("}");
	}
	else
	{
		// We have to assume that the next keyword
		// starts a new top level block
		sc.UnGet();
		return true;
	}
}